

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O2

int __thiscall TPZFrontSym<float>::ClassId(TPZFrontSym<float> *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"TPZFrontSym",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = TPZFront<float>::ClassId(&this->super_TPZFront<float>);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZFrontSym<TVar>::ClassId() const{
    return Hash("TPZFrontSym") ^ TPZFront<TVar>::ClassId() << 1;
}